

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O0

void __thiscall EnrichableSpiAnalyzer::EnrichableSpiAnalyzer(EnrichableSpiAnalyzer *this)

{
  EnrichableSpiAnalyzerSettings *this_00;
  EnrichableAnalyzerSubprocess *this_01;
  EnrichableSpiAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__EnrichableSpiAnalyzer_00120c50;
  this_00 = (EnrichableSpiAnalyzerSettings *)operator_new(0xc0);
  EnrichableSpiAnalyzerSettings::EnrichableSpiAnalyzerSettings(this_00);
  std::auto_ptr<EnrichableSpiAnalyzerSettings>::auto_ptr(&this->mSettings,this_00);
  std::auto_ptr<EnrichableSpiAnalyzerResults>::auto_ptr(&this->mResults,(element_type *)0x0);
  this->mSimulationInitilized = false;
  this_01 = (EnrichableAnalyzerSubprocess *)operator_new(0x40);
  EnrichableAnalyzerSubprocess::EnrichableAnalyzerSubprocess(this_01);
  std::auto_ptr<EnrichableAnalyzerSubprocess>::auto_ptr(&this->mSubprocess,this_01);
  EnrichableSpiSimulationDataGenerator::EnrichableSpiSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mMosi = (AnalyzerChannelData *)0x0;
  this->mMiso = (AnalyzerChannelData *)0x0;
  this->mClock = (AnalyzerChannelData *)0x0;
  this->mEnable = (AnalyzerChannelData *)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&this->mArrowLocations);
  this->packetFrameIndex = '\0';
  std::auto_ptr<EnrichableSpiAnalyzerSettings>::get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  return;
}

Assistant:

EnrichableSpiAnalyzer::EnrichableSpiAnalyzer()
:	Analyzer2(),
	mSettings( new EnrichableSpiAnalyzerSettings() ),
	mSimulationInitilized( false ),
	mMosi( NULL ),
	mMiso( NULL ),
	mClock( NULL ),
	mEnable( NULL ),
	mSubprocess( new EnrichableAnalyzerSubprocess() )
{	
	SetAnalyzerSettings( mSettings.get() );
}